

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void oss_gets_backsp(osgen_txtwin_t *win,char *buf,char **p,char **eol,int *x,int *y)

{
  ulong uVar1;
  int iVar2;
  osgen_win_t *in_RCX;
  ulong *in_RDX;
  int *in_RSI;
  osgen_txtwin_t *in_RDI;
  int *in_R8;
  int *in_R9;
  int tmpx;
  int tmpy;
  int color;
  undefined8 uVar3;
  int in_stack_ffffffffffffffc0;
  int iVar4;
  
  iVar2 = ossgetcolor((int)in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
                      (int)((ulong)in_RCX >> 0x20));
  if (in_RSI < (int *)*in_RDX) {
    *in_RDX = *in_RDX - 1;
    *(ulong *)in_RCX = *(ulong *)in_RCX - 1;
    uVar1._0_4_ = in_RCX->win_type;
    uVar1._4_4_ = in_RCX->flags;
    if (*in_RDX != uVar1) {
      memmove((void *)*in_RDX,(void *)(*in_RDX + 1),*(ulong *)in_RCX - *in_RDX);
    }
    iVar4 = *in_R8;
    *in_R8 = iVar4 + -1;
    if (iVar4 + -1 < (in_RDI->base).winx) {
      *in_R8 = (in_RDI->base).winx + (int)(in_RDI->base).wid + -1;
      *in_R9 = *in_R9 + -1;
    }
    **(undefined1 **)in_RCX = 0;
    iVar4 = *in_R8;
    uVar3 = 0;
    ossdsp_str(in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8,(int)((ulong)in_R9 >> 0x20),
               (char *)CONCAT44(iVar2,*in_R9),CONCAT44(iVar4,in_stack_ffffffffffffffc0),in_RSI);
    oss_gets_csrright(in_RDI,(int *)&stack0xffffffffffffffc8,(int *)&stack0xffffffffffffffc4,
                      *(long *)in_RCX - *in_RDX);
    ossclr(iVar4,in_stack_ffffffffffffffc0,(int)((ulong)uVar3 >> 0x20),(int)uVar3,0);
  }
  return;
}

Assistant:

static void oss_gets_backsp(osgen_txtwin_t *win,
                            char *buf, char **p,
                            char **eol, int *x, int *y)
{
    int color;

    /* get the oss color for the current text in the window */
    color = ossgetcolor(win->base.txtfg, win->base.txtbg,
                        win->base.txtattr, win->base.fillcolor);

    /* if we can back up, do so */
    if (*p > buf)
    {
        int tmpy;
        int tmpx;

        /* move our insertion point back one position */
        --*p;
        
        /* the line is now one character shorter */
        --*eol;

        /* shift all of the characters down one position */
        if (*p != *eol)
            memmove(*p, *p + 1, *eol - *p);

        /* move the cursor back, wrapping if at the first column */
        if (--*x < win->base.winx)
        {
            *x = win->base.winx + win->base.wid - 1;
            --*y;
        }

        /* null-terminate the shortened buffer */
        **eol = '\0';

        /* 
         *   display the string from the current position, so that we update
         *   the display for the moved characters 
         */
        tmpy = *y;
        tmpx = *x;
        ossdsp_str(&win->base, tmpy, tmpx, color, *p, *eol - *p, 0);

        /* clear the screen area where the old last character was shown */
        oss_gets_csrright(win, &tmpy, &tmpx, *eol - *p);
        ossclr(tmpy, tmpx, tmpy, tmpx, win->base.oss_fillcolor);
    }
}